

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O2

ostream * plot::detail::operator<<(ostream *stream,value_type *line)

{
  TerminalMode TVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  ostream *poVar6;
  Frame<plot::BrailleCanvas_*> *pFVar7;
  size_t sVar8;
  char *pcVar9;
  size_t sVar10;
  bool bVar11;
  label_line local_88;
  size_t local_78;
  char *pcStack_70;
  Label local_60;
  
  pFVar7 = line->frame_;
  sVar2 = pFVar7->block_->cols_;
  sVar8 = (pFVar7->border_).top_left._M_len;
  pcVar9 = (pFVar7->border_).top_left._M_str;
  local_78 = (pFVar7->border_).top._M_len;
  pcStack_70 = (pFVar7->border_).top._M_str;
  if (line->overflow_ < 0) {
    sVar10 = (pFVar7->border_).top_right._M_len;
    pcVar3 = (pFVar7->border_).top_right._M_str;
    local_60.text_._M_len = (pFVar7->label_)._M_len;
    local_60.text_._M_str = (pFVar7->label_)._M_str;
    local_60.align_ = pFVar7->align_;
    local_88.label_ = &local_60;
    local_88.overflow_ = 0;
    TVar1 = (pFVar7->term_).mode;
    local_60.width_ = sVar2;
    local_60.fill_._M_len = local_78;
    local_60.fill_._M_str = pcStack_70;
    if ((TVar1 != None) && (TVar1 != Windows)) {
      ansi::reset(stream);
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar9,sVar8);
    poVar6 = operator<<(poVar6,&local_88);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar3,sVar10);
    return poVar6;
  }
  TVar1 = (pFVar7->term_).mode;
  if ((line->line_).line_.it_._M_current == (line->end_).line_.it_._M_current) {
    sVar10 = (pFVar7->border_).bottom_left._M_len;
    pcVar3 = (pFVar7->border_).bottom_left._M_str;
    sVar4 = (pFVar7->border_).bottom._M_len;
    pcVar5 = (pFVar7->border_).bottom._M_str;
    sVar8 = (pFVar7->border_).bottom_right._M_len;
    pcVar9 = (pFVar7->border_).bottom_right._M_str;
    if ((TVar1 != None) && (TVar1 != Windows)) {
      ansi::reset(stream);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar3,sVar10);
    sVar10 = 0;
    if (0 < (long)sVar2) {
      sVar10 = sVar2;
    }
    while (bVar11 = sVar10 != 0, sVar10 = sVar10 - 1, bVar11) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar5,sVar4);
    }
  }
  else {
    if ((TVar1 != None) && (TVar1 != Windows)) {
      ansi::reset(stream);
      pFVar7 = line->frame_;
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,(pFVar7->border_).left._M_str,(pFVar7->border_).left._M_len);
    stream = braille::operator<<(poVar6,&(line->line_).line_);
    pFVar7 = line->frame_;
    TVar1 = (pFVar7->term_).mode;
    if ((TVar1 != None) && (TVar1 != Windows)) {
      ansi::reset(stream);
      pFVar7 = line->frame_;
    }
    sVar8 = (pFVar7->border_).right._M_len;
    pcVar9 = (pFVar7->border_).right._M_str;
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar9,sVar8);
  return poVar6;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, frame_line<Block> const& line) {
        auto size = detail::block_traits<Block>::size(line.frame_->block_);
        auto const border = line.frame_->border_;

        if (line.overflow_ < 0) {
            auto lbl = label(line.frame_->label_, line.frame_->align_, size.x, border.top);
            auto lbl_line = *lbl.cbegin();

            return stream << line.frame_->term_.reset()
                          << border.top_left << lbl_line << border.top_right;
        } else if (line.line_ == line.end_) {
            stream << line.frame_->term_.reset() << border.bottom_left;

            for (auto i = 0; i < size.x; ++i)
                stream << border.bottom;

            return stream << border.bottom_right;
        }

        return stream << line.frame_->term_.reset()
                      << line.frame_->border_.left
                      << *line.line_
                      << line.frame_->term_.reset()
                      << line.frame_->border_.right;
    }